

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall RtMidiOut::RtMidiOut(RtMidiOut *this,Api api,string *clientName)

{
  int iVar1;
  ostream *this_00;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  RtMidiError *this_01;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string errorText;
  undefined1 local_48 [4];
  uint i;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  string *clientName_local;
  Api api_local;
  RtMidiOut *this_local;
  
  RtMidi::RtMidi(&this->super_RtMidi);
  (this->super_RtMidi)._vptr_RtMidi = (_func_int **)&PTR_openPort_001209c8;
  if (api != UNSPECIFIED) {
    openMidiApi(this,api,clientName);
    if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
      return;
    }
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "\nRtMidiOut: no compiled support for specified API argument!\n\n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_48);
  RtMidi::getCompiledApi((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_48);
  for (errorText.field_2._12_4_ = 0; uVar2 = (ulong)(uint)errorText.field_2._12_4_,
      sVar3 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                        ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_48),
      uVar2 < sVar3; errorText.field_2._12_4_ = errorText.field_2._12_4_ + 1) {
    pvVar4 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                       ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_48,
                        (ulong)(uint)errorText.field_2._12_4_);
    openMidiApi(this,*pvVar4,clientName);
    if (((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) &&
       (iVar1 = (*((this->super_RtMidi).rtapi_)->_vptr_MidiApi[8])(), iVar1 != 0)) break;
  }
  if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
    std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~vector
              ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_48);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"RtMidiOut: no compiled API support found ... critical error!!",
             &local_71);
  std::allocator<char>::~allocator(&local_71);
  this_01 = (RtMidiError *)__cxa_allocate_exception(0x30);
  RtMidiError::RtMidiError(this_01,(string *)local_70,UNSPECIFIED);
  __cxa_throw(this_01,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
}

Assistant:

RTMIDI_DLL_PUBLIC RtMidiOut :: RtMidiOut( RtMidi::Api api, const std::string &clientName)
{
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openMidiApi( api, clientName );
    if ( rtapi_ ) return;

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    std::cerr << "\nRtMidiOut: no compiled support for specified API argument!\n\n" << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one port or we reach the end of the list.
  std::vector< RtMidi::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openMidiApi( apis[i], clientName );
    if ( rtapi_ && rtapi_->getPortCount() ) break;
  }

  if ( rtapi_ ) return;

  // It should not be possible to get here because the preprocessor
  // definition __RTMIDI_DUMMY__ is automatically defined if no
  // API-specific definitions are passed to the compiler. But just in
  // case something weird happens, we'll thrown an error.
  std::string errorText = "RtMidiOut: no compiled API support found ... critical error!!";
  throw( RtMidiError( errorText, RtMidiError::UNSPECIFIED ) );
}